

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CS248::Application::drawHUD(Application *this)

{
  long in_RDI;
  OSDText *unaff_retaddr;
  float y;
  int inc;
  float y0;
  float x0;
  size_t size;
  float local_6c;
  ulong local_68;
  allocator local_41;
  string local_40 [32];
  float local_20;
  int local_1c;
  float local_18;
  float local_14;
  undefined8 local_10;
  
  OSDText::clear((OSDText *)0x1caa7f);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1caa90);
  local_10 = 0x10;
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_68 = *(long *)(in_RDI + 0x1d8) - 300;
  }
  else {
    local_68 = *(long *)(in_RDI + 0x1d8) - 600;
  }
  local_6c = (float)local_68;
  local_14 = local_6c;
  local_18 = (float)(byte)((*(byte *)(in_RDI + 8) & 1) * '@' + 0x40);
  local_1c = 0x18;
  if ((*(byte *)(in_RDI + 8) & 1) != 0) {
    local_1c = 0x30;
  }
  local_20 = local_18 + (float)local_1c + -16.0;
  OSDText::render(unaff_retaddr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"end Application::drawHUD",&local_41);
  checkGLError((string *)0x1cabad);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void Application::drawHUD() {
    textManager.clear();
    messages.clear();

    const size_t size = 16;
    const float x0 = use_hdpi ? screenW - 300 * 2 : screenW - 300;
    const float y0 = use_hdpi ? 128 : 64;
    const int inc = use_hdpi ? 48 : 24;
    float y = y0 + inc - size;

    textManager.render();

    checkGLError("end Application::drawHUD");
}